

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

LongShort * findshortopt(char letter)

{
  long lVar1;
  
  if ((byte)(letter + 0x81U) < 0xa2) {
    return (LongShort *)0x0;
  }
  if (findshortopt_singles_done == '\0') {
    lVar1 = 0;
    do {
      if ((ulong)(byte)(&aliases[0].letter)[lVar1] != 0x20) {
        getparameter::redir_protos[(ulong)(byte)(&aliases[0].letter)[lVar1] + 4] =
             (char *)((long)&aliases[0].lname + lVar1);
      }
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x1130);
    findshortopt_singles_done = '\x01';
  }
  return findshortopt::singles[(uint)(int)(char)(letter + -0x20)];
}

Assistant:

const struct LongShort *findshortopt(char letter)
{
  static const struct LongShort *singles[128 - ' ']; /* ASCII => pointer */
  static bool singles_done = FALSE;
  if((letter >= 127) || (letter <= ' '))
    return NULL;

  if(!singles_done) {
    unsigned int j;
    for(j = 0; j < CURL_ARRAYSIZE(aliases); j++) {
      if(aliases[j].letter != ' ') {
        unsigned char l = (unsigned char)aliases[j].letter;
        singles[l - ' '] = &aliases[j];
      }
    }
    singles_done = TRUE;
  }
  return singles[letter - ' '];
}